

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction.cpp
# Opt level: O0

pair<std::shared_ptr<void>,_pstore::address> * __thiscall
pstore::transaction_base::alloc_rw
          (pair<std::shared_ptr<void>,_pstore::address> *__return_storage_ptr__,
          transaction_base *this,size_t size,uint align)

{
  int iVar1;
  undefined4 extraout_var;
  shared_ptr<const_void> local_50;
  undefined1 local_40 [8];
  shared_ptr<void> ptr;
  address addr;
  uint align_local;
  size_t size_local;
  transaction_base *this_local;
  
  iVar1 = (*this->_vptr_transaction_base[2])(this,size,(ulong)align);
  ptr.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CONCAT44(extraout_var,iVar1);
  (*this->db_->_vptr_database[2])
            (&local_50,this->db_,
             ptr.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi,size,0,1);
  std::const_pointer_cast<void,void_const>((shared_ptr<const_void> *)local_40);
  std::shared_ptr<const_void>::~shared_ptr(&local_50);
  std::pair<std::shared_ptr<void>,_pstore::address>::pair<std::shared_ptr<void>_&,_true>
            (__return_storage_ptr__,(shared_ptr<void> *)local_40,
             (address *)&ptr.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::shared_ptr<void>::~shared_ptr((shared_ptr<void> *)local_40);
  return __return_storage_ptr__;
}

Assistant:

std::pair<std::shared_ptr<void>, address> transaction_base::alloc_rw (std::size_t const size,
                                                                          unsigned const align) {
        address const addr = this->allocate (size, align);
        // We call database::get() with the initialized parameter set to false because this
        // is new storage: there's no need to copy its existing contents if the block spans
        // more than one region.
        auto ptr = std::const_pointer_cast<void> (db_.get (addr, size,
                                                           false,  // initialized?
                                                           true)); // writable?
        return {ptr, addr};
    }